

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O2

bool __thiscall
ObjectModelBuilder::buildProperty(ObjectModelBuilder *this,string *propertyString,Class *clazz)

{
  long lVar1;
  ostream *poVar2;
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70 [32];
  undefined1 local_50 [8];
  string prop;
  
  string_trim((string *)local_50,propertyString);
  lVar1 = std::__cxx11::string::find_last_of((char *)local_50,0x11de98);
  if (lVar1 == -1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"error: invalid property: ");
    poVar2 = std::operator<<(poVar2,(string *)local_50);
    poVar2 = std::operator<<(poVar2," in class: ");
    poVar2 = std::operator<<(poVar2,(string *)clazz);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    local_b0._M_p = (pointer)&local_a0;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_90._M_p = (pointer)&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_b8 = (undefined1  [8])clazz;
    std::__cxx11::string::substr((ulong)local_70,(ulong)local_50);
    std::__cxx11::string::operator=((string *)&local_90,local_70);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::substr((ulong)local_70,(ulong)local_50);
    std::__cxx11::string::operator=((string *)&local_b0,local_70);
    std::__cxx11::string::~string(local_70);
    std::vector<Property,_std::allocator<Property>_>::push_back
              (&clazz->properties,(value_type *)local_b8);
    if (this->m_verbose == true) {
      poVar2 = std::operator<<((ostream *)&std::cerr," - property: type=\'");
      poVar2 = std::operator<<(poVar2,(string *)&local_90);
      poVar2 = std::operator<<(poVar2,"\', name=\'");
      poVar2 = std::operator<<(poVar2,(string *)&local_b0);
      poVar2 = std::operator<<(poVar2,"\'");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    Property::~Property((Property *)local_b8);
  }
  std::__cxx11::string::~string((string *)local_50);
  return lVar1 != -1;
}

Assistant:

bool ObjectModelBuilder::buildProperty(const std::string &propertyString, Class *clazz)
{
    std::string prop = string_trim(propertyString);
    size_t space = prop.find_last_of(" ");
    if (space == std::string::npos) {
        std::cerr << "error: invalid property: " << prop << " in class: " << clazz->name << std::endl;
        return false;
    }
    Property property;
    property.clazz = clazz;
    property.type = prop.substr(0, space);
    property.name = prop.substr(space+1);

    clazz->properties.push_back(property);

    if (m_verbose)
        std::cerr << " - property: type='" << property.type << "', name='" << property.name << "'" << std::endl;

    return true;
}